

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

int Bac_NtkBuildLibrary(Bac_Man_t *p)

{
  Mio_Library_t *pLib_00;
  Mio_Library_t *pLib;
  int RetValue;
  Bac_Man_t *p_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib_00 != (Mio_Library_t *)0x0) {
    Bac_NtkPrepareLibrary(p,pLib_00);
  }
  else {
    printf("The standard cell library is not available.\n");
  }
  pLib._4_4_ = (uint)(pLib_00 != (Mio_Library_t *)0x0);
  p->pMioLib = pLib_00;
  return pLib._4_4_;
}

Assistant:

int Bac_NtkBuildLibrary( Bac_Man_t * p )
{
    int RetValue = 1;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
        printf( "The standard cell library is not available.\n" ), RetValue = 0;
    else
        Bac_NtkPrepareLibrary( p, pLib );
    p->pMioLib = pLib;
    return RetValue;
}